

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O2

Value __thiscall duckdb_tdigest::TDigest::quantile(TDigest *this,Value q)

{
  bool bVar1;
  Value VVar2;
  
  if ((this->unprocessed_).
      super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->unprocessed_).
      super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    bVar1 = isDirty(this);
    if (!bVar1) goto LAB_01bb52dc;
  }
  process(this);
LAB_01bb52dc:
  VVar2 = quantileProcessed(this,q);
  return VVar2;
}

Assistant:

Value quantile(Value q) {
		if (haveUnprocessed() || isDirty()) {
			process();
		}
		return quantileProcessed(q);
	}